

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshrand.c
# Opt level: O0

void random_save_seed(void)

{
  void *local_18;
  void *data;
  int len;
  
  if (random_active != 0) {
    random_get_savedata(&local_18,(int *)((long)&data + 4));
    write_random_seed(local_18,data._4_4_);
    safefree(local_18);
  }
  return;
}

Assistant:

void random_save_seed(void)
{
    int len;
    void *data;

    if (random_active) {
        random_get_savedata(&data, &len);
        write_random_seed(data, len);
        sfree(data);
    }
}